

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

void __thiscall
TPZSkylMatrix<std::complex<float>_>::Read
          (TPZSkylMatrix<std::complex<float>_> *this,TPZStream *buf,void *context)

{
  complex<float> *pcVar1;
  long lVar2;
  long lVar3;
  complex<float> *pcVar4;
  TPZVec<long> skyl;
  TPZVec<long> local_40;
  long local_20;
  
  TPZBaseMatrix::Read((TPZBaseMatrix *)this,buf,context);
  TPZStream::Read<std::complex<float>>(buf,&this->fStorage,(void *)0x0);
  local_20 = 0;
  TPZVec<long>::TPZVec
            (&local_40,(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow + 1,
             &local_20);
  TPZStream::Read<long>(buf,&local_40,(void *)0x0);
  pcVar1 = (complex<float> *)(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  pcVar4 = pcVar1;
  if (pcVar1 != (complex<float> *)0x0) {
    pcVar4 = (this->fStorage).fStore;
  }
  TPZVec<std::complex<float>_*>::Resize(&this->fElem,(int64_t)((long)&pcVar1->_M_value + 1));
  lVar2 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  if (-1 < lVar2) {
    lVar3 = 0;
    do {
      (this->fElem).fStore[lVar3] = pcVar4 + local_40.fStore[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar2 + 1 != lVar3);
  }
  local_40._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
  if (local_40.fStore != (long *)0x0) {
    operator_delete__(local_40.fStore);
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::Read(TPZStream &buf, void *context )
{
    TPZMatrix<TVar>::Read(buf, context);
    buf.Read( fStorage);
    TPZVec<int64_t> skyl(this->Rows()+1,0);
    buf.Read( skyl);
    TVar *ptr = 0;
    if (this->Rows()) {
        ptr = &fStorage[0];
    }
    fElem.Resize(this->Rows()+1);
    for (int64_t i=0; i<this->Rows()+1; i++) {
        fElem[i] = skyl[i] + ptr;
    }
}